

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

void __thiscall
QActionPrivate::setShortcutEnabled(QActionPrivate *this,bool enable,QShortcutMap *map)

{
  bool bVar1;
  QAction *this_00;
  const_iterator o;
  int *piVar2;
  byte in_SIL;
  QActionPrivate *in_RDI;
  long in_FS_OFFSET;
  int id;
  add_const_t<QList<int>_> *__range1;
  QAction *q;
  const_iterator __end1;
  const_iterator __begin1;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar3;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar4;
  QList<int> *pQVar5;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  pQVar5 = &in_RDI->shortcutIds;
  local_10.i = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<int>::begin((QList<int> *)
                               CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  o = QList<int>::end((QList<int> *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  while( true ) {
    bVar1 = QList<int>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    piVar2 = QList<int>::const_iterator::operator*(&local_10);
    iVar4 = *piVar2;
    if (iVar4 != 0) {
      bVar3 = in_SIL & 1;
      QKeySequence::QKeySequence((QKeySequence *)0x975192);
      QShortcutMap::setShortcutEnabled
                ((QShortcutMap *)this_00,SUB81((ulong)pQVar5 >> 0x38,0),(int)pQVar5,
                 (QObject *)CONCAT44(iVar4,in_stack_ffffffffffffffa8),(QKeySequence *)in_RDI);
      QKeySequence::~QKeySequence((QKeySequence *)CONCAT17(bVar3,in_stack_ffffffffffffff80));
    }
    QList<int>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QActionPrivate::setShortcutEnabled(bool enable, QShortcutMap &map)
{
    Q_Q(QAction);
    for (int id : std::as_const(shortcutIds)) {
        if (id)
            map.setShortcutEnabled(enable, id, q);
    }
}